

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O3

void node::fav_child_processing_order<node::TreeIndexJSON>
               (TreeIndexJSON *ti,int *postorder,int *favorder)

{
  int iVar1;
  int iVar2;
  pointer pvVar3;
  pointer piVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  iVar2 = *postorder;
  pvVar3 = (ti->super_PostLToChildren).postl_to_children_.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)((long)&pvVar3[iVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
      != *(pointer *)&pvVar3[iVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
    fav_child_processing_order<node::TreeIndexJSON>
              (ti,(ti->super_PostLToFavChild).postl_to_fav_child_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + iVar2,favorder);
    iVar2 = *postorder;
    lVar6 = (long)iVar2;
    pvVar3 = (ti->super_PostLToChildren).postl_to_children_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar4 = *(pointer *)&pvVar3[lVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl;
    if (*(pointer *)((long)&pvVar3[lVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
        != piVar4) {
      uVar5 = 1;
      uVar7 = 0;
      do {
        if (piVar4[uVar7] !=
            (ti->super_PostLToFavChild).postl_to_fav_child_.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar6]) {
          fav_child_processing_order<node::TreeIndexJSON>(ti,piVar4 + uVar7,favorder);
          iVar2 = *postorder;
          pvVar3 = (ti->super_PostLToChildren).postl_to_children_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        uVar7 = (ulong)uVar5;
        lVar6 = (long)iVar2;
        piVar4 = *(pointer *)&pvVar3[lVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl;
        uVar5 = uVar5 + 1;
      } while (uVar7 < (ulong)((long)*(pointer *)
                                      ((long)&pvVar3[lVar6].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      + 8) - (long)piVar4 >> 2));
    }
  }
  iVar1 = *favorder;
  *favorder = iVar1 + 1;
  (ti->super_PostLToFavorableChildOrder).postl_to_favorder_.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[iVar1] =
       iVar2;
  return;
}

Assistant:

void fav_child_processing_order(TreeIndex& ti, int& postorder, int& favorder) {
  // Perform recursively for children.
  if (ti.postl_to_children_[postorder].size() != 0) {
    // First process the favorable child.
    fav_child_processing_order(ti, ti.postl_to_fav_child_[postorder], favorder);
    // Next, process all other children.
    for (unsigned int t = 0; t < ti.postl_to_children_[postorder].size(); ++t) {
      // Favorable child was processed before.
      if (ti.postl_to_children_[postorder][t] == ti.postl_to_fav_child_[postorder]) {
        continue;
      }
      // Process other children in left to right order.
      fav_child_processing_order(ti, ti.postl_to_children_[postorder][t], favorder);
    }
  }
  // Assign favorder to postorder.
  ti.postl_to_favorder_[favorder++] = postorder;
}